

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshChannelControl.cpp
# Opt level: O0

void __thiscall
TPZMHMixedMeshChannelControl::BuildComputationalMesh
          (TPZMHMixedMeshChannelControl *this,bool usersubstructure,bool OpenChannel,
          map<int,_std::pair<TPZGeoElSide,_TPZGeoElSide>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>_>
          *oppen_channel)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  TPZGeoEl *pTVar5;
  TPZGeoEl *pTVar6;
  int64_t index;
  long *plVar7;
  TPZCompEl *this_00;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar9;
  TPZCompMesh *pTVar10;
  ostream *this_01;
  int64_t iVar11;
  void *this_02;
  byte in_DL;
  byte in_SIL;
  long *in_RDI;
  TPZMHMixedMeshChannelControl *in_stack_00000030;
  int64_t conenec_from_to;
  TPZConnect *cto;
  TPZConnect *cfrom;
  int64_t cto_index;
  int64_t cfrom_index;
  int connec_to_index;
  int connec_from_index;
  int c_to_index;
  int c_from_index;
  int side_to;
  TPZCompEl *cel_to;
  TPZCompEl *cel_from;
  TPZGeoEl *gel_to;
  TPZGeoEl *gel_from;
  int mhm2;
  int mhm1;
  int64_t gel_to_index;
  int64_t gel_from_index;
  TPZGeoEl *gel_to_orig;
  int side_from;
  TPZGeoEl *gel_from_orig;
  pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_> it;
  iterator __end2;
  iterator __begin2;
  map<int,_std::pair<TPZGeoElSide,_TPZGeoElSide>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>_>
  *__range2;
  size_t in_stack_00000238;
  char *in_stack_00000240;
  TPZMHMixedMeshControl *in_stack_fffffffffffffe18;
  TPZGeoMesh *in_stack_fffffffffffffe20;
  TPZCompMesh *in_stack_fffffffffffffe30;
  TPZCompMesh *in_stack_fffffffffffffe50;
  TPZMHMixedMeshControl *in_stack_fffffffffffffeb0;
  TPZMHMixedMeshControl *in_stack_ffffffffffffff30;
  TPZAutoPointer<TPZCompMesh> local_80 [4];
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  _Self local_30;
  _Self local_28 [3];
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  if (((int)in_RDI[0x16] == 0) || (*(int *)((long)in_RDI + 0xb4) == 0)) {
    pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
  }
  (**(code **)(*in_RDI + 0x30))();
  TPZMHMixedMeshControl::CreateHDivMHMMesh(in_stack_fffffffffffffeb0);
  if ((local_a & 1) == 1) {
    local_28[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_std::pair<TPZGeoElSide,_TPZGeoElSide>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>_>
         ::begin((map<int,_std::pair<TPZGeoElSide,_TPZGeoElSide>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>_>
                  *)in_stack_fffffffffffffe18);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_std::pair<TPZGeoElSide,_TPZGeoElSide>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>_>
         ::end((map<int,_std::pair<TPZGeoElSide,_TPZGeoElSide>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>_>
                *)in_stack_fffffffffffffe18);
    while (bVar1 = std::operator!=(local_28,&local_30), bVar1) {
      std::_Rb_tree_iterator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>::
      operator*((_Rb_tree_iterator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_> *)
                in_stack_fffffffffffffe20);
      std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>::pair
                ((pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_> *)
                 in_stack_fffffffffffffe20,
                 (pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_> *)
                 in_stack_fffffffffffffe18);
      TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
      TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffe30);
      TPZMHMixedMeshControl::FluxMesh(in_stack_fffffffffffffe18);
      TPZAutoPointer<TPZCompMesh>::operator->(local_80);
      TPZCompMesh::LoadReferences(in_stack_fffffffffffffe30);
      TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer
                ((TPZAutoPointer<TPZCompMesh> *)in_stack_fffffffffffffe20);
      pTVar5 = TPZGeoElSide::Element(&local_60);
      iVar2 = TPZGeoElSide::Side(&local_60);
      pTVar6 = TPZGeoElSide::Element(&local_48);
      iVar11 = TPZGeoEl::Index(pTVar5);
      index = TPZGeoEl::Index(pTVar6);
      plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),iVar11);
      lVar8 = *plVar7;
      plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),index);
      if ((int)lVar8 == (int)*plVar7) {
        pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
      }
      TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
      pTVar5 = TPZGeoMesh::Element(in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18);
      TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
      pTVar6 = TPZGeoMesh::Element(in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18);
      this_00 = TPZGeoEl::Reference(pTVar5);
      in_stack_ffffffffffffff30 = (TPZMHMixedMeshControl *)TPZGeoEl::Reference(pTVar6);
      iVar3 = TPZGeoElSide::Side(&local_48);
      TPZCompEl::Index(this_00);
      in_stack_fffffffffffffe50 =
           (TPZCompMesh *)TPZCompEl::Index((TPZCompEl *)in_stack_ffffffffffffff30);
      iVar2 = iVar2 + -4;
      uVar4 = iVar3 - 4;
      lVar8 = (**(code **)(*(long *)this_00 + 0xa0))(this_00,iVar2);
      iVar3 = (*(in_stack_ffffffffffffff30->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x14])
                        (in_stack_ffffffffffffff30,(ulong)uVar4);
      if (lVar8 == CONCAT44(extraout_var,iVar3)) {
        pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
      }
      (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar2);
      iVar3 = (*(in_stack_ffffffffffffff30->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x15])
                        (in_stack_ffffffffffffff30,(ulong)uVar4);
      in_stack_fffffffffffffe30 = (TPZCompMesh *)CONCAT44(extraout_var_00,iVar3);
      TPZConnect::RemoveDepend((TPZConnect *)in_stack_fffffffffffffe20);
      TPZConnect::RemoveDepend((TPZConnect *)in_stack_fffffffffffffe20);
      uVar9 = (**(code **)(*(long *)this_00 + 0xa0))(this_00,iVar2);
      (*(in_stack_ffffffffffffff30->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x41])
                (in_stack_ffffffffffffff30,(ulong)uVar4,uVar9);
      std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>::~pair
                ((pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_> *)0x1f41abe);
      std::_Rb_tree_iterator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_>::
      operator++((_Rb_tree_iterator<std::pair<const_int,_std::pair<TPZGeoElSide,_TPZGeoElSide>_>_> *
                 )in_stack_fffffffffffffe20);
    }
  }
  pTVar10 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x3d));
  (**(code **)(*(long *)pTVar10 + 0x88))();
  pTVar10 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x3d));
  (**(code **)(*(long *)pTVar10 + 0x60))();
  (**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RDI + 0x80))();
  TPZMHMixedMeshControl::CreateHDivPressureMHMMesh(in_stack_ffffffffffffff30);
  this_01 = std::operator<<((ostream *)&std::cout,"Total number of equations ");
  pTVar10 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  TPZCompMesh::Solution(pTVar10);
  iVar11 = TPZSolutionMatrix::Rows((TPZSolutionMatrix *)0x1f41b86);
  this_02 = (void *)std::ostream::operator<<(this_01,iVar11);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  iVar11 = TPZCompMesh::NEquations(in_stack_fffffffffffffe50);
  in_RDI[0x3b] = iVar11;
  pTVar10 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  TPZCompMesh::Solution(pTVar10);
  iVar11 = TPZSolutionMatrix::Rows((TPZSolutionMatrix *)0x1f41be3);
  in_RDI[0x3a] = iVar11;
  pTVar10 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  (**(code **)(*(long *)pTVar10 + 0x78))();
  if ((local_9 & 1) != 0) {
    HideTheElements(in_stack_00000030);
  }
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  iVar11 = TPZCompMesh::NEquations(in_stack_fffffffffffffe50);
  in_RDI[0x3c] = iVar11;
  return;
}

Assistant:

void TPZMHMixedMeshChannelControl::BuildComputationalMesh(bool usersubstructure,bool OpenChannel,std::map<int,std::pair<TPZGeoElSide,TPZGeoElSide>> oppen_channel){
 
    
    if (fpOrderInternal == 0 || fpOrderSkeleton == 0) {
        DebugStop();
    }
    InsertPeriferalMaterialObjects();
    CreateHDivMHMMesh();
    
    if(OpenChannel==true){
        for(auto it:oppen_channel){
            fGMesh->ResetReference();
            FluxMesh()->LoadReferences();
            TPZGeoEl *gel_from_orig = it.second.first.Element();
            int side_from = it.second.first.Side();
            TPZGeoEl *gel_to_orig = it.second.second.Element();
            int64_t gel_from_index = gel_from_orig->Index();
            int64_t gel_to_index = gel_to_orig->Index();
            int mhm1 = fGeoToMHMDomain[gel_from_index];
            int mhm2 = fGeoToMHMDomain[gel_to_index];
            if(mhm1 == mhm2) DebugStop();
            TPZGeoEl *gel_from = fGMesh->Element(gel_from_index);
            TPZGeoEl *gel_to = fGMesh->Element(gel_to_index);
            TPZCompEl *cel_from = gel_from->Reference();
            TPZCompEl *cel_to = gel_to->Reference();
            int side_to = it.second.second.Side();
            int c_from_index = cel_from->Index();
            int c_to_index = cel_to->Index();
            int connec_from_index = side_from - 4;
            int connec_to_index = side_to - 4;
            int64_t cfrom_index = cel_from->ConnectIndex(connec_from_index);
            int64_t cto_index = cel_to->ConnectIndex(connec_to_index);
            if(cfrom_index == cto_index) DebugStop();
            TPZConnect &cfrom = cel_from->Connect(connec_from_index);
            TPZConnect &cto = cel_to->Connect(connec_to_index);
            cfrom.RemoveDepend();
            cto.RemoveDepend();
    //        FluxMesh()->Element(c_from_index)->Connect(connec_from_index).RemoveDepend();
    //        FluxMesh()->Element(c_to_index)->Connect(connec_to_index).RemoveDepend();
            auto conenec_from_to = cel_from->ConnectIndex(connec_from_index);
            cel_to->SetConnectIndex(connec_to_index, conenec_from_to);
        }
    }
    

        
    
    fFluxMesh->CleanUpUnconnectedNodes();
    fFluxMesh->ExpandSolution();
    InsertPeriferalPressureMaterialObjects();
    
#ifdef PZDEBUG
    if (fFluxMesh->Dimension() != fGMesh->Dimension()) {
        DebugStop();
    }
#endif
    
    CreatePressureMHMMesh();
    
    
    CreateHDivPressureMHMMesh();
    std::cout << "Total number of equations " << fCMesh->Solution().Rows() << std::endl;
    fGlobalSystemWithLocalCondensationSize = fCMesh->NEquations();
    fGlobalSystemSize = fCMesh->Solution().Rows();
    
    fCMesh->ComputeNodElCon();
#ifdef PZDEBUG
    {
        std::ofstream out("Friendly.txt");
        PrintFriendly(out);
    }
    CheckMeshConsistency();
#endif
    
    if (usersubstructure) {
        HideTheElements();
    }
    fNumeq = fCMesh->NEquations();
#ifdef PZDEBUG2
    {
        int64_t nel = fCMesh->NElements();
        for(int64_t el = 0; el<nel; el++)
        {
            TPZCompEl *cel = fCMesh->Element(el);
            TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
            if(sub)
            {
                std::stringstream sout;
                sout << "submesh_" << el << ".vtk";
                std::ofstream file(sout.str());
                TPZVTKGeoMesh::PrintCMeshVTK(sub, file,true);
            }
        }
        fCMesh->LoadReferences();
        std::ofstream out("cmesh_substruct.vtk");
        TPZVTKGeoMesh::PrintCMeshVTK(fCMesh->Reference(), out,true);
    }
#endif

}